

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
dynet::PickRange::dim_forward
          (Dim *__return_storage_ptr__,PickRange *this,
          vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  uint uVar1;
  pointer pDVar2;
  invalid_argument *this_00;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ostringstream s;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pDVar2 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 != 0x24) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes-common.cc"
                  ,0x29f,"virtual Dim dynet::PickRange::dim_forward(const vector<Dim> &) const");
  }
  uVar4 = (ulong)pDVar2->nd;
  if (1 < uVar4) {
    uVar5 = 1;
    do {
      if (pDVar2->d[uVar5] != 1) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Bad input dimensions in PickElement: ",0x25);
        operator<<((ostream *)local_190,xs);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,local_1b0);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  uVar1 = this->end;
  if (uVar4 == 0) {
    uVar3 = 1;
  }
  else {
    uVar3 = pDVar2->d[0];
  }
  if (uVar1 <= uVar3) {
    uVar3 = this->start;
    __return_storage_ptr__->bd = pDVar2->bd;
    __return_storage_ptr__->nd = 1;
    __return_storage_ptr__->d[0] = uVar1 - uVar3;
    return __return_storage_ptr__;
  }
  __assert_fail("end <= xs[0][0]",
                "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes-common.cc"
                ,0x2a4,"virtual Dim dynet::PickRange::dim_forward(const vector<Dim> &) const");
}

Assistant:

Dim RandomBernoulli::dim_forward(const vector<Dim>& xs) const {
  return dim;
}